

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::Workitem,_true,_false>::allocate
          (LinkedListPool<depspawn::internal::Workitem,_true,_false> *this)

{
  int iVar1;
  int iVar2;
  vector_t *pvVar3;
  __int_type_conflict _Var4;
  LinkedListPool<depspawn::internal::Workitem,_true,_false> *this_00;
  Workitem *last_datain;
  Workitem *in_RDI;
  Workitem *p;
  Workitem *q;
  Workitem *h;
  char *endptr;
  char *baseptr;
  memory_order __b;
  atomic<int> *__x;
  LinkedListPool<depspawn::internal::Workitem,_true,_false> *local_30;
  
  this_00 = (LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
            PoolAllocator_malloc_free<false>::malloc
                      ((long)(*(int *)&in_RDI->next * *(int *)((long)&in_RDI->next + 4)));
  iVar1 = *(int *)((long)&in_RDI->next + 4);
  iVar2 = *(int *)&in_RDI->next;
  pvVar3 = &this_00->v_;
  local_30 = this_00;
  do {
    local_30 = (LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
               ((long)&(local_30->v_).
                       super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                       ._M_impl.super__Vector_impl_data._M_start +
               (long)*(int *)((long)&in_RDI->next + 4));
    depspawn::internal::Workitem::Workitem((Workitem *)0x1216e8);
    *(LinkedListPool<depspawn::internal::Workitem,_true,_false> **)&this_00->chunkSize_ = local_30;
    this_00 = *(LinkedListPool<depspawn::internal::Workitem,_true,_false> **)&this_00->chunkSize_;
  } while (local_30 <=
           (LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
           ((long)&(pvVar3->
                   super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                   )._M_impl.super__Vector_impl_data._M_start + (long)(iVar1 * (iVar2 + -1))));
  do {
    __x = &in_RDI->ndependencies;
    last_datain = (Workitem *)0x1;
    LOCK();
    _Var4 = (__x->super___atomic_base<int>)._M_i;
    *(undefined1 *)&(__x->super___atomic_base<int>)._M_i = 1;
    UNLOCK();
  } while ((char)_Var4 != '\0');
  std::vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>::
  push_back((vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
             *)0x1,(value_type *)__x);
  freeLinkedList(this_00,in_RDI,last_datain,SUB81((ulong)__x >> 0x38,0));
  std::operator&(memory_order_release,__memory_order_mask);
  *(undefined1 *)&(in_RDI->ndependencies).super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }